

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

int log_init(log_handle *log)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)log->priv;
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)calloc(1,0x10);
    if (puVar1 == (undefined8 *)0x0) {
      return -0xc;
    }
    log->priv = puVar1;
  }
  log->level = 3;
  log->medium = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  return 0;
}

Assistant:

int log_init(struct log_handle *log)
{
	struct log_priv *priv = log->priv;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		log->priv = priv;
	}

	log->medium = LOG_MEDIUM_NONE;
	log->level = LOG_LEVEL_INFO;

	priv->medium_eventlog.handle = NULL;
	priv->medium_file.fp = NULL;

	return 0;
}